

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

NumToEntryTable * __thiscall
google::protobuf::internal::anon_unknown_36::MakeNumToEntryTable
          (NumToEntryTable *__return_storage_ptr__,anon_unknown_36 *this,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields)

{
  int iVar1;
  size_type sVar2;
  reference pFVar3;
  char *failure_msg;
  LogMessage *pLVar4;
  ulong uVar5;
  reference pvVar6;
  byte bVar7;
  value_type local_b4;
  uint local_b0;
  uint local_ac;
  uint32_t skip_entry_index;
  uint32_t skip_entry_num;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
  local_a0;
  LogMessage local_88;
  Voidify local_75 [13];
  uint local_68;
  uint local_64;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *pFStack_50;
  uint32_t fnum;
  FieldDescriptor *field_descriptor_1;
  uint32_t last_skip_entry_start;
  bool start_new_block;
  SkipEntryBlock *block;
  FieldDescriptor *pFStack_30;
  int skipmap32_index;
  FieldDescriptor *field_descriptor;
  undefined1 auStack_20 [2];
  uint16_t N;
  uint16_t field_entry_index;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields_local;
  NumToEntryTable *num_to_entry_table;
  
  ordered_fields_local.ptr_ = ordered_fields.ptr_;
  field_descriptor._7_1_ = 0;
  _auStack_20 = (pointer)this;
  ordered_fields_local.len_ = (size_type)__return_storage_ptr__;
  TailCallTableInfo::NumToEntryTable::NumToEntryTable(__return_storage_ptr__);
  __return_storage_ptr__->skipmap32 = 0xffffffff;
  field_descriptor._4_2_ = 0;
  sVar2 = absl::lts_20250127::
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::size
                    ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                     auStack_20);
  field_descriptor._2_2_ = (ushort)sVar2;
  for (; field_descriptor._4_2_ != field_descriptor._2_2_;
      field_descriptor._4_2_ = field_descriptor._4_2_ + 1) {
    pFVar3 = absl::lts_20250127::
             Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                       ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *)
                        auStack_20,(ulong)field_descriptor._4_2_);
    pFStack_30 = pFVar3->field;
    iVar1 = FieldDescriptor::number(pFStack_30);
    if (0x20 < iVar1) break;
    iVar1 = FieldDescriptor::number(pFStack_30);
    block._4_4_ = iVar1 + -1;
    __return_storage_ptr__->skipmap32 =
         __return_storage_ptr__->skipmap32 - (1 << ((byte)block._4_4_ & 0x1f));
  }
  if (field_descriptor._4_2_ != field_descriptor._2_2_) {
    _last_skip_entry_start = (reference)0x0;
    field_descriptor_1._7_1_ = 1;
    field_descriptor_1._0_4_ = 0;
    for (; field_descriptor._4_2_ != field_descriptor._2_2_;
        field_descriptor._4_2_ = field_descriptor._4_2_ + 1) {
      pFVar3 = absl::lts_20250127::
               Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions>::operator[]
                         ((Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> *
                          )auStack_20,(ulong)field_descriptor._4_2_);
      pFStack_50 = pFVar3->field;
      absl_log_internal_check_op_result._4_4_ = FieldDescriptor::number(pFStack_50);
      local_64 = absl::lts_20250127::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result._4_4_);
      local_68 = absl::lts_20250127::log_internal::GetReferenceableValue((uint)field_descriptor_1);
      local_60 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                           (&local_64,&local_68,"fnum > last_skip_entry_start");
      if (local_60 != (Nullable<const_char_*>)0x0) {
        failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x1e9,failure_msg);
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_88);
        absl::lts_20250127::log_internal::Voidify::operator&&(local_75,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_88);
      }
      if (((field_descriptor_1._7_1_ & 1) == 0) &&
         (0x60 < absl_log_internal_check_op_result._4_4_ - (uint)field_descriptor_1)) {
        field_descriptor_1._7_1_ = 1;
      }
      if ((field_descriptor_1._7_1_ & 1) != 0) {
        skip_entry_index = absl_log_internal_check_op_result._4_4_;
        local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a0.
        super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ::vector(&local_a0);
        std::
        vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
        ::push_back(&__return_storage_ptr__->blocks,(value_type *)&skip_entry_index);
        TailCallTableInfo::SkipEntryBlock::~SkipEntryBlock((SkipEntryBlock *)&skip_entry_index);
        _last_skip_entry_start =
             std::
             vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
             ::back(&__return_storage_ptr__->blocks);
        field_descriptor_1._7_1_ = 0;
      }
      local_ac = absl_log_internal_check_op_result._4_4_ - _last_skip_entry_start->first_fnum >> 4;
      local_b0 = absl_log_internal_check_op_result._4_4_ - _last_skip_entry_start->first_fnum & 0xf;
      while (uVar5 = (ulong)local_ac,
            sVar2 = std::
                    vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
                    ::size(&_last_skip_entry_start->entries), sVar2 <= uVar5) {
        local_b4.skipmap = 0xffff;
        local_b4.field_entry_offset = field_descriptor._4_2_;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
        ::push_back(&_last_skip_entry_start->entries,&local_b4);
      }
      bVar7 = (byte)local_b0;
      pvVar6 = std::
               vector<google::protobuf::internal::TailCallTableInfo::SkipEntry16,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntry16>_>
               ::operator[](&_last_skip_entry_start->entries,(ulong)local_ac);
      pvVar6->skipmap = pvVar6->skipmap - (short)(1 << (bVar7 & 0x1f));
      field_descriptor_1._0_4_ = absl_log_internal_check_op_result._4_4_ - local_b0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TailCallTableInfo::NumToEntryTable MakeNumToEntryTable(
    absl::Span<const TailCallTableInfo::FieldOptions> ordered_fields) {
  TailCallTableInfo::NumToEntryTable num_to_entry_table;
  num_to_entry_table.skipmap32 = static_cast<uint32_t>(-1);

  // skip_entry_block is the current block of SkipEntries that we're
  // appending to.  cur_block_first_fnum is the number of the first
  // field represented by the block.
  uint16_t field_entry_index = 0;
  uint16_t N = ordered_fields.size();
  // First, handle field numbers 1-32, which affect only the initial
  // skipmap32 and don't generate additional skip-entry blocks.
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    if (field_descriptor->number() > 32) break;
    auto skipmap32_index = field_descriptor->number() - 1;
    num_to_entry_table.skipmap32 -= 1 << skipmap32_index;
  }
  // If all the field numbers were less than or equal to 32, we will have
  // no further entries to process, and we are already done.
  if (field_entry_index == N) return num_to_entry_table;

  TailCallTableInfo::SkipEntryBlock* block = nullptr;
  bool start_new_block = true;
  // To determine sparseness, track the field number corresponding to
  // the start of the most recent skip entry.
  uint32_t last_skip_entry_start = 0;
  for (; field_entry_index != N; ++field_entry_index) {
    auto* field_descriptor = ordered_fields[field_entry_index].field;
    uint32_t fnum = static_cast<uint32_t>(field_descriptor->number());
    ABSL_CHECK_GT(fnum, last_skip_entry_start);
    if (start_new_block == false) {
      // If the next field number is within 15 of the last_skip_entry_start, we
      // continue writing just to that entry.  If it's between 16 and 31 more,
      // then we just extend the current block by one. If it's more than 31
      // more, we have to add empty skip entries in order to continue using the
      // existing block.  Obviously it's just 32 more, it doesn't make sense to
      // start a whole new block, since new blocks mean having to write out
      // their starting field number, which is 32 bits, as well as the size of
      // the additional block, which is 16... while an empty SkipEntry16 only
      // costs 32 bits.  So if it was 48 more, it's a slight space win; we save
      // 16 bits, but probably at the cost of slower run time.  We're choosing
      // 96 for now.
      if (fnum - last_skip_entry_start > 96) start_new_block = true;
    }
    if (start_new_block) {
      num_to_entry_table.blocks.push_back({fnum});
      block = &num_to_entry_table.blocks.back();
      start_new_block = false;
    }

    auto skip_entry_num = (fnum - block->first_fnum) / 16;
    auto skip_entry_index = (fnum - block->first_fnum) % 16;
    while (skip_entry_num >= block->entries.size())
      block->entries.push_back({0xFFFF, field_entry_index});
    block->entries[skip_entry_num].skipmap -= 1 << (skip_entry_index);

    last_skip_entry_start = fnum - skip_entry_index;
  }
  return num_to_entry_table;
}